

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.h
# Opt level: O0

string * __thiscall dlib::impl1::msg_data::data_to_string_abi_cxx11_(msg_data *this)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  reference pvVar4;
  __shared_ptr *in_RSI;
  string *in_RDI;
  __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffa0;
  allocator *paVar5;
  allocator local_25 [20];
  allocator local_11 [17];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3c844d);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(peVar2);
    if (sVar3 != 0) {
      peVar2 = std::
               __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_ffffffffffffffa0);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](peVar2,0);
      peVar2 = std::
               __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3c8484);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(peVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,pvVar4,sVar3,local_11);
      std::allocator<char>::~allocator((allocator<char> *)local_11);
      return in_RDI;
    }
  }
  paVar5 = local_25;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",paVar5);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  return in_RDI;
}

Assistant:

std::string data_to_string() const
            {
                if (data && data->size() != 0)
                    return std::string(&(*data)[0], data->size());
                else
                    return "";
            }